

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

string * __thiscall
WorldShuffler::random_hint_for_item_abi_cxx11_
          (string *__return_storage_ptr__,WorldShuffler *this,Item *item)

{
  bool bVar1;
  reference ppIVar2;
  ItemSource *randomSource;
  allocator<char> local_39;
  undefined1 local_38 [8];
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  Item *item_local;
  WorldShuffler *this_local;
  
  sources.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)item;
  RandomizerWorld::item_sources_with_item
            ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_38,this->_world,item);
  bVar1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::empty
                    ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"in an unknown place",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    vectools::shuffle<ItemSource*>
              ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_38,&this->_rng);
    ppIVar2 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::operator[]
                        ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_38,0);
    random_hint_for_item_source_abi_cxx11_(__return_storage_ptr__,this,*ppIVar2);
  }
  std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector
            ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string WorldShuffler::random_hint_for_item(Item* item)
{
    std::vector<ItemSource*> sources = _world.item_sources_with_item(item);
    if(sources.empty())
        return "in an unknown place";

    vectools::shuffle(sources, _rng);
    ItemSource* randomSource = sources[0];
    return this->random_hint_for_item_source(randomSource);
}